

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::IsPopupOpen(ImGuiID id,ImGuiPopupFlags popup_flags)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  
  uVar2 = (GImGui->OpenPopupStack).Size;
  if ((char)popup_flags < '\0') {
    if (((uint)popup_flags >> 8 & 1) == 0) {
      uVar1 = (GImGui->BeginPopupStack).Size;
      bVar6 = SBORROW4(uVar2,uVar1);
      bVar5 = uVar2 == uVar1;
      uVar2 = uVar2 - uVar1;
    }
    else {
      bVar6 = false;
      bVar5 = uVar2 == 0;
    }
    return !bVar5 && bVar6 == (int)uVar2 < 0;
  }
  if (((uint)popup_flags >> 8 & 1) == 0) {
    iVar3 = (GImGui->BeginPopupStack).Size;
    if ((int)uVar2 <= iVar3) {
      return false;
    }
    bVar5 = (GImGui->OpenPopupStack).Data[iVar3].PopupId == id;
  }
  else {
    if ((int)uVar2 < 1) {
      return false;
    }
    lVar4 = 0;
    do {
      bVar5 = *(ImGuiID *)((long)&((GImGui->OpenPopupStack).Data)->PopupId + lVar4) == id;
      if (bVar5) {
        return bVar5;
      }
      bVar6 = (ulong)uVar2 * 0x30 + -0x30 != lVar4;
      lVar4 = lVar4 + 0x30;
    } while (bVar6);
  }
  return bVar5;
}

Assistant:

bool ImGui::IsPopupOpen(ImGuiID id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    if (popup_flags & ImGuiPopupFlags_AnyPopupId)
    {
        // Return true if any popup is open at the current BeginPopup() level of the popup stack
        // This may be used to e.g. test for another popups already opened to handle popups priorities at the same level.
        IM_ASSERT(id == 0);
        if (popup_flags & ImGuiPopupFlags_AnyPopupLevel)
            return g.OpenPopupStack.Size > 0;
        else
            return g.OpenPopupStack.Size > g.BeginPopupStack.Size;
    }
    else
    {
        if (popup_flags & ImGuiPopupFlags_AnyPopupLevel)
        {
            // Return true if the popup is open anywhere in the popup stack
            for (int n = 0; n < g.OpenPopupStack.Size; n++)
                if (g.OpenPopupStack[n].PopupId == id)
                    return true;
            return false;
        }
        else
        {
            // Return true if the popup is open at the current BeginPopup() level of the popup stack (this is the most-common query)
            return g.OpenPopupStack.Size > g.BeginPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].PopupId == id;
        }
    }
}